

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_AmrMesh.cpp
# Opt level: O3

void __thiscall
amrex::AmrMesh::AmrMesh
          (AmrMesh *this,RealBox *rb,int max_level_in,Vector<int,_std::allocator<int>_> *n_cell_in,
          int coord,Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *a_refrat,int *is_per)

{
  pointer pIVar1;
  pointer pIVar2;
  Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> local_48;
  
  AmrInfo::AmrInfo(&this->super_AmrInfo);
  this->_vptr_AmrMesh = (_func_int **)&PTR__AmrMesh_00714a48;
  (this->geom).super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
  super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->geom).super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
  super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->geom).super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
  super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->dmap).super_vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
  .super__Vector_base<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->dmap).super_vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
  .super__Vector_base<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->dmap).super_vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
  .super__Vector_base<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->grids).super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>.
  super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->grids).super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>.
  super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->grids).super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>.
  super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->num_setdm = 0;
  this->num_setba = 0;
  Geometry::Setup(rb,coord,is_per);
  pIVar1 = (a_refrat->super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>).
           super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_48.super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
  super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (a_refrat->super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>).
       super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
       super__Vector_impl_data._M_finish;
  pIVar2 = (a_refrat->super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>).
           super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  (a_refrat->super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>).
  super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (a_refrat->super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>).
  super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (a_refrat->super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>).
  super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_48.super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
  super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
  super__Vector_impl_data._M_start = pIVar1;
  local_48.super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
  super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = pIVar2;
  InitAmrMesh(this,max_level_in,n_cell_in,&local_48,rb,coord,is_per);
  if (pIVar1 != (pointer)0x0) {
    operator_delete(pIVar1,(long)pIVar2 - (long)pIVar1);
    return;
  }
  return;
}

Assistant:

AmrMesh::AmrMesh (const RealBox* rb, int max_level_in,
                  const Vector<int>& n_cell_in, int coord,
                  Vector<IntVect> a_refrat, const int* is_per)
{
    Geometry::Setup(rb,coord,is_per);
    InitAmrMesh(max_level_in,n_cell_in, std::move(a_refrat), rb, coord, is_per);
}